

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool SingleTreeSearchHelperBoolTolerance
               (ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResultBoolTolerance *a_result)

{
  bool bVar1;
  ON_RTreeBranch *pOVar2;
  ON_RTreeBranch *branchBmax;
  ON_RTreeBranch *branchB;
  ON_RTreePairSearchCallbackResultBoolTolerance *a_result_local;
  ON_RTreeNode *a_nodeB_local;
  ON_RTreeBranch *a_branchA_local;
  
  branchBmax = a_nodeB->m_branch;
  pOVar2 = branchBmax + a_nodeB->m_count;
  if (a_nodeB->m_level < 1) {
    for (; branchBmax < pOVar2; branchBmax = branchBmax + 1) {
      if (((a_branchA < branchBmax) &&
          (bVar1 = PairSearchOverlapHelper
                             (&a_branchA->m_rect,&branchBmax->m_rect,a_result->m_tolerance), bVar1))
         && (bVar1 = (*a_result->m_resultCallbackBoolTolerance)
                               (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                                (ON__INT_PTR)(branchBmax->field_1).m_child,&a_result->m_tolerance),
            !bVar1)) {
        return false;
      }
    }
  }
  else {
    for (; branchBmax < pOVar2; branchBmax = branchBmax + 1) {
      bVar1 = PairSearchOverlapHelper(&a_branchA->m_rect,&branchBmax->m_rect,a_result->m_tolerance);
      if ((bVar1) &&
         (bVar1 = SingleTreeSearchHelperBoolTolerance
                            (a_branchA,(branchBmax->field_1).m_child,a_result), !bVar1)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

static bool SingleTreeSearchHelperBoolTolerance(const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResultBoolTolerance* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;

  if (a_nodeB->m_level > 0)
  {
    // branchB's have children nodes and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
      {
        if (!SingleTreeSearchHelperBoolTolerance(a_branchA, branchB->m_child, a_result))
          return false;
      }
      branchB++;
    }
  }
  else
  {
    // branchB's are all leaves
    while (branchB < branchBmax)
    {
      if (a_branchA < branchB)
      {
        if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          if (!a_result->m_resultCallbackBoolTolerance(a_result->m_context, a_branchA->m_id, branchB->m_id, &a_result->m_tolerance))
            return false;
        }
      }
      branchB++;
    }
  }

  return true;
}